

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O3

ngx_int_t ngx_parse_addr_port(ngx_pool_t *pool,ngx_addr_t *addr,u_char *text,size_t len)

{
  long lVar1;
  u_char uVar2;
  long lVar3;
  ngx_int_t nVar4;
  long lVar5;
  ngx_int_t nVar6;
  u_char *puVar7;
  size_t sVar8;
  u_char *puVar9;
  
  nVar4 = ngx_parse_addr(pool,addr,text,len);
  if (nVar4 != -5) {
    return nVar4;
  }
  nVar4 = -5;
  if (len == 0) {
    return -5;
  }
  if (*text == '[') {
    if ((long)len < 1) {
      return -5;
    }
    lVar5 = len - 1;
    puVar7 = text + 1;
    do {
      if (lVar5 == 0) {
        return -5;
      }
      puVar9 = puVar7 + 1;
      lVar5 = lVar5 + -1;
      uVar2 = *puVar7;
      puVar7 = puVar9;
    } while (uVar2 != ']');
    if (lVar5 == 0) {
      return -5;
    }
    if (*puVar9 != ':') {
      return -5;
    }
    sVar8 = len - 2;
    puVar7 = text + 1;
  }
  else {
    if ((long)len < 1) {
      return -5;
    }
    sVar8 = len;
    puVar7 = text;
    puVar9 = text;
    if (*text != ':') {
      lVar5 = 0;
      do {
        if (len - 1 == lVar5) {
          return -5;
        }
        lVar1 = lVar5 + 1;
        lVar3 = lVar5 + 1;
        lVar5 = lVar1;
      } while (text[lVar3] != ':');
      puVar9 = text + lVar1;
    }
  }
  nVar6 = ngx_atoi(puVar9 + 1,(size_t)(text + (len - (long)(puVar9 + 1))));
  if ((0xffffffffffff0000 < nVar6 - 0x10000U) &&
     (nVar4 = ngx_parse_addr(pool,addr,puVar7,sVar8 + ~(ulong)(text + (len - (long)(puVar9 + 1)))),
     nVar4 == 0)) {
    if (addr->sockaddr->sa_family != 1) {
      *(ushort *)addr->sockaddr->sa_data = (ushort)nVar6 << 8 | (ushort)nVar6 >> 8;
    }
    nVar4 = 0;
  }
  return nVar4;
}

Assistant:

ngx_int_t
ngx_parse_addr_port(ngx_pool_t *pool, ngx_addr_t *addr, u_char *text,
    size_t len)
{
    u_char     *p, *last;
    size_t      plen;
    ngx_int_t   rc, port;

    rc = ngx_parse_addr(pool, addr, text, len);

    if (rc != NGX_DECLINED) {
        return rc;
    }

    last = text + len;

#if (NGX_HAVE_INET6)
    if (len && text[0] == '[') {

        p = ngx_strlchr(text, last, ']');

        if (p == NULL || p == last - 1 || *++p != ':') {
            return NGX_DECLINED;
        }

        text++;
        len -= 2;

    } else
#endif

    {
        p = ngx_strlchr(text, last, ':');

        if (p == NULL) {
            return NGX_DECLINED;
        }
    }

    p++;
    plen = last - p;

    port = ngx_atoi(p, plen);

    if (port < 1 || port > 65535) {
        return NGX_DECLINED;
    }

    len -= plen + 1;

    rc = ngx_parse_addr(pool, addr, text, len);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_inet_set_port(addr->sockaddr, (in_port_t) port);

    return NGX_OK;
}